

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Volume.h
# Opt level: O3

void idx2::CopyGridGrid<double,float>(grid *SGrid,volume *SVol,grid *DGrid,volume *DVol)

{
  u64 uVar1;
  u64 uVar2;
  u64 uVar3;
  u64 uVar4;
  u64 uVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  float *pfVar9;
  long lVar10;
  double *pdVar11;
  long lVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  int iVar17;
  long lVar18;
  int iVar19;
  long lVar20;
  float *pfVar21;
  long lVar22;
  double *pdVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  float *local_88;
  double *local_70;
  
  uVar1 = (SGrid->super_extent).Dims;
  uVar2 = SGrid->Strd;
  lVar8 = (long)(uVar2 * 2) >> 0x2b;
  iVar13 = (int)((long)(uVar1 * 2) >> 0x2b) * (int)((long)(uVar2 * 2) >> 0x2b);
  if (0 < iVar13) {
    uVar3 = (SGrid->super_extent).From;
    lVar25 = (long)(uVar3 << 0x2b) >> 0x2b;
    uVar4 = (DGrid->super_extent).From;
    lVar24 = (long)(SVol->Dims << 0x2b) >> 0x2b;
    lVar22 = (long)(uVar3 * 2) >> 0x2b;
    lVar10 = (long)(SVol->Dims << 0x16) >> 0x2b;
    lVar14 = (long)(uVar3 << 0x16) >> 0x2b;
    local_70 = (double *)
               ((SVol->Buffer).Data + (lVar14 * 8 + lVar10 * lVar22 * 8) * lVar24 + lVar25 * 8);
    lVar20 = (long)(DVol->Dims << 0x16) >> 0x2b;
    lVar12 = (long)(uVar2 << 0x2b) >> 0x2b;
    uVar5 = DGrid->Strd;
    lVar16 = (long)(DVol->Dims << 0x2b) >> 0x2b;
    local_88 = (float *)((DVol->Buffer).Data +
                        (((long)(uVar4 << 0x16) >> 0x2b) * 4 +
                        ((long)(uVar4 * 2) >> 0x2b) * lVar20 * 4) * lVar16 +
                        ((long)(uVar4 << 0x2b) >> 0x2b) * 4);
    iVar7 = (int)((long)(uVar3 << 0x16) >> 0x2b);
    iVar19 = (int)((long)(uVar1 << 0x16) >> 0x2b) * (int)((long)(uVar2 << 0x16) >> 0x2b) + iVar7;
    iVar6 = (int)((long)(uVar3 << 0x2b) >> 0x2b);
    iVar17 = (int)((long)(uVar1 << 0x2b) >> 0x2b) * (int)((long)(uVar2 << 0x2b) >> 0x2b) + iVar6;
    lVar15 = (long)(uVar2 << 0x16) >> 0x2b;
    do {
      pfVar21 = local_88;
      pdVar23 = local_70;
      lVar26 = lVar14;
      if (iVar7 < iVar19) {
        do {
          pfVar9 = pfVar21;
          pdVar11 = pdVar23;
          lVar18 = lVar25;
          if (iVar6 < iVar17) {
            do {
              *pfVar9 = (float)*pdVar11;
              lVar18 = lVar18 + lVar12;
              pfVar9 = pfVar9 + ((long)(uVar5 << 0x2b) >> 0x2b);
              pdVar11 = pdVar11 + lVar12;
            } while (lVar18 < iVar17);
          }
          lVar26 = lVar26 + lVar15;
          pfVar21 = pfVar21 + ((long)(uVar5 << 0x16) >> 0x2b) * lVar16;
          pdVar23 = pdVar23 + lVar24 * lVar15;
        } while (lVar26 < iVar19);
      }
      lVar22 = lVar22 + lVar8;
      local_70 = local_70 + lVar10 * lVar8 * lVar24;
      local_88 = local_88 + lVar20 * ((long)(uVar5 * 2) >> 0x2b) * lVar16;
    } while (lVar22 < iVar13 + (int)((long)(uVar3 * 2) >> 0x2b));
  }
  return;
}

Assistant:

idx2_Inline v3i
Dims(const grid& Grid)
{
  return Unpack3i64(Grid.Dims);
}